

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int endswith(char *str,char *postfix)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  sVar2 = strlen(str);
  pcVar3 = str + sVar2;
  pcVar4 = ".";
  while( true ) {
    pcVar3 = pcVar3 + -1;
    if (pcVar3 < str) {
      return 1;
    }
    if (pcVar4 < "/.") break;
    cVar1 = *pcVar4;
    pcVar4 = pcVar4 + -1;
    if (*pcVar3 != cVar1) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int
endswith(const char * str, const char * postfix)
{
    const char * p = str + strlen(str) - 1;
    const char * q = postfix + strlen(postfix) - 1;
    for(; p >= str && q >= postfix; p --, q--) {
        if(*p != *q) return 0;
    }
    return 1;
}